

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::heart::Parser::findProcessorInstance(Parser *this,string *instanceName)

{
  bool bVar1;
  __type_conflict1 _Var2;
  Module *pMVar3;
  reference ppVar4;
  ProcessorInstance *pPVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CompileMessage local_a0;
  int local_64;
  pool_ptr<soul::heart::ProcessorInstance> local_60;
  pool_ref<soul::heart::ProcessorInstance> local_58;
  pool_ref<soul::heart::ProcessorInstance> m;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *__range2;
  string *instanceName_local;
  Parser *this_local;
  pool_ptr<soul::heart::ProcessorInstance> *result;
  
  pool_ptr<soul::heart::ProcessorInstance>::pool_ptr
            ((pool_ptr<soul::heart::ProcessorInstance> *)this);
  pMVar3 = pool_ptr<soul::Module>::operator->
                     ((pool_ptr<soul::Module> *)&instanceName[4]._M_string_length);
  __end2 = std::
           vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ::begin(&pMVar3->processorInstances);
  m.object = (ProcessorInstance *)
             std::
             vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
             ::end(&pMVar3->processorInstances);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
                                     *)&m), bVar1) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
             ::operator*(&__end2);
    local_58.object = ppVar4->object;
    pPVar5 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_58);
    _Var2 = std::operator==(&pPVar5->instanceName,in_RDX);
    if (_Var2) {
      pool_ref::operator_cast_to_pool_ptr((pool_ref *)&local_60);
      (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser = (_func_int **)local_60.object;
      pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr(&local_60);
      local_64 = 2;
    }
    else {
      local_64 = 0;
    }
    pool_ref<soul::heart::ProcessorInstance>::~pool_ref(&local_58);
    if (local_64 != 0) break;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = pool_ptr<soul::heart::ProcessorInstance>::operator==
                    ((pool_ptr<soul::heart::ProcessorInstance> *)this,(void *)0x0);
  if (bVar1) {
    Errors::cannotFindProcessor<std::__cxx11::string_const&>(&local_a0,(Errors *)in_RDX,args);
    (**(code **)(*(long *)instanceName + 0x10))(instanceName,&local_a0);
    CompileMessage::~CompileMessage(&local_a0);
  }
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<heart::ProcessorInstance> findProcessorInstance (const std::string& instanceName)
    {
        pool_ptr<heart::ProcessorInstance> result;

        for (auto m : module->processorInstances)
        {
            if (m->instanceName == instanceName)
            {
                result = m;
                break;
            }
        }

        if (result == nullptr)
            throwError (Errors::cannotFindProcessor (instanceName));

        return result;
    }